

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

QLatin1StringView __thiscall
QMimeBinaryProvider::iconForMime
          (QMimeBinaryProvider *this,CacheFile *cacheFile,int posListOffset,QByteArray *inputMime)

{
  uint uVar1;
  uchar *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *str2;
  long unaff_R12;
  int iVar8;
  long lVar9;
  uchar *unaff_R15;
  QLatin1StringView QVar10;
  
  uVar1 = *(uint *)(cacheFile->data + posListOffset);
  uVar5 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = *(uint *)(cacheFile->data + (int)uVar5);
  iVar8 = (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) - 1;
  iVar7 = 0;
  do {
    if (iVar8 < iVar7) {
      unaff_R12 = 0;
      unaff_R15 = (uchar *)0x0;
      break;
    }
    str2 = (inputMime->d).ptr;
    if (str2 == (char *)0x0) {
      str2 = "";
    }
    uVar6 = (uint)(iVar7 + iVar8) >> 1;
    lVar9 = (long)(int)(uVar5 + 4 + uVar6 * 8);
    uVar1 = *(uint *)(cacheFile->data + lVar9);
    iVar4 = qstrcmp((char *)(cacheFile->data +
                            (int)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                                 uVar1 << 0x18)),str2);
    if (iVar4 < 0) {
      iVar7 = uVar6 + 1;
      bVar3 = true;
    }
    else if (iVar4 == 0) {
      puVar2 = cacheFile->data;
      uVar1 = *(uint *)(puVar2 + lVar9 + 4);
      unaff_R15 = puVar2 + (int)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                                uVar1 << 0x18);
      if (puVar2 == (uchar *)0x0) {
        unaff_R12 = 0;
      }
      else {
        unaff_R12 = -1;
        do {
          lVar9 = unaff_R12 + 1;
          unaff_R12 = unaff_R12 + 1;
        } while (unaff_R15[lVar9] != '\0');
      }
      bVar3 = false;
    }
    else {
      iVar8 = uVar6 - 1;
      bVar3 = true;
    }
  } while (bVar3);
  QVar10.m_data = (char *)unaff_R15;
  QVar10.m_size = unaff_R12;
  return QVar10;
}

Assistant:

QLatin1StringView QMimeBinaryProvider::iconForMime(CacheFile *cacheFile, int posListOffset,
                                                   const QByteArray &inputMime)
{
    const int iconsListOffset = cacheFile->getUint32(posListOffset);
    const int numIcons = cacheFile->getUint32(iconsListOffset);
    int begin = 0;
    int end = numIcons - 1;
    while (begin <= end) {
        const int medium = (begin + end) / 2;
        const int off = iconsListOffset + 4 + 8 * medium;
        const int mimeOffset = cacheFile->getUint32(off);
        const char *mime = cacheFile->getCharStar(mimeOffset);
        const int cmp = qstrcmp(mime, inputMime);
        if (cmp < 0)
            begin = medium + 1;
        else if (cmp > 0)
            end = medium - 1;
        else {
            const int iconOffset = cacheFile->getUint32(off + 4);
            return QLatin1StringView(cacheFile->getCharStar(iconOffset));
        }
    }
    return QLatin1StringView();
}